

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

UBool __thiscall
icu_63::MessagePatternList<icu_63::MessagePattern::Part,_32>::equals
          (MessagePatternList<icu_63::MessagePattern::Part,_32> *this,
          MessagePatternList<icu_63::MessagePattern::Part,_32> *other,int32_t length)

{
  ulong uVar1;
  UBool UVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = 0;
  uVar5 = 0;
  if (0 < length) {
    uVar5 = (ulong)(uint)length;
  }
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar5 == uVar3) break;
    UVar2 = MessagePattern::Part::operator!=
                      ((Part *)((long)&((this->a).ptr)->type + lVar4),
                       (Part *)((long)&((other->a).ptr)->type + lVar4));
    lVar4 = lVar4 + 0x10;
    uVar1 = uVar3 + 1;
  } while (UVar2 == '\0');
  return (long)length <= (long)uVar3;
}

Assistant:

UBool equals(const MessagePatternList<T, stackCapacity> &other, int32_t length) const {
        for(int32_t i=0; i<length; ++i) {
            if(a[i]!=other.a[i]) { return FALSE; }
        }
        return TRUE;
    }